

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O0

float ncnn::reduction<ncnn::reduction_op_sumexp>
                (float v0,float *ptr,int size0,int stride0,int size1,int stride1)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  float *in_RDI;
  int in_R8D;
  float in_XMM0_Da;
  int j;
  float *ptr0;
  int i;
  float sum;
  reduction_op_sumexp op;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar1;
  float *x;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar2;
  float local_28;
  float *local_10;
  
  local_28 = in_XMM0_Da;
  local_10 = in_RDI;
  for (iVar2 = 0; iVar2 < in_ECX; iVar2 = iVar2 + 1) {
    x = local_10;
    for (iVar1 = 0; iVar1 < in_ESI; iVar1 = iVar1 + 1) {
      local_28 = reduction_op_sumexp::operator()
                           ((reduction_op_sumexp *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),x,
                            (float *)CONCAT44(iVar1,in_stack_ffffffffffffffc0));
      x = x + in_EDX;
    }
    local_10 = local_10 + in_R8D;
  }
  return local_28;
}

Assistant:

static float reduction(float v0, const float* ptr, int size0, int stride0, int size1, int stride1)
{
    Op op;

    float sum = v0;
    for (int i = 0; i < size1; i++)
    {
        const float* ptr0 = ptr;
        for (int j = 0; j < size0; j++)
        {
            sum = op(sum, *ptr0);
            ptr0 += stride0;
        }
        ptr += stride1;
    }

    return sum;
}